

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

bool initialiseScatterData(HighsInt max_num_point,HighsScatterData *scatter_data)

{
  if (0 < max_num_point) {
    scatter_data->max_num_point_ = max_num_point;
    scatter_data->num_point_ = 0;
    scatter_data->last_point_ = -1;
    std::vector<double,_std::allocator<double>_>::resize
              (&scatter_data->value0_,(ulong)(uint)max_num_point);
    std::vector<double,_std::allocator<double>_>::resize
              (&scatter_data->value1_,(ulong)(uint)max_num_point);
    scatter_data->have_regression_coeff_ = false;
    scatter_data->num_error_comparison_ = 0;
    scatter_data->num_awful_linear_ = 0;
    scatter_data->num_awful_log_ = 0;
    scatter_data->num_bad_linear_ = 0;
    scatter_data->num_bad_log_ = 0;
    scatter_data->num_fair_linear_ = 0;
    scatter_data->num_fair_log_ = 0;
    scatter_data->num_better_linear_ = 0;
    scatter_data->num_better_log_ = 0;
  }
  return 0 < max_num_point;
}

Assistant:

bool initialiseScatterData(const HighsInt max_num_point,
                           HighsScatterData& scatter_data) {
  if (max_num_point < 1) return false;
  scatter_data.max_num_point_ = max_num_point;
  scatter_data.num_point_ = 0;
  scatter_data.last_point_ = -1;
  scatter_data.value0_.resize(max_num_point);
  scatter_data.value1_.resize(max_num_point);
  scatter_data.have_regression_coeff_ = false;
  scatter_data.num_error_comparison_ = 0;
  scatter_data.num_awful_linear_ = 0;
  scatter_data.num_awful_log_ = 0;
  scatter_data.num_bad_linear_ = 0;
  scatter_data.num_bad_log_ = 0;
  scatter_data.num_fair_linear_ = 0;
  scatter_data.num_fair_log_ = 0;
  scatter_data.num_better_linear_ = 0;
  scatter_data.num_better_log_ = 0;
  return true;
}